

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O1

uint32_t __thiscall asmjit::InstNode::getRewriteIndex(InstNode *this,uint32_t *id)

{
  BaseCompiler **ppBVar1;
  RABlock **item;
  uint32_t *puVar2;
  char *pcVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint *puVar6;
  Logger *this_00;
  FuncNode *pFVar7;
  RABlock *pRVar8;
  BaseNode *pBVar9;
  BaseRAPass *pBVar10;
  Error EVar11;
  Error EVar12;
  Error EVar13;
  RABlock *pRVar14;
  undefined8 extraout_RAX;
  byte bVar15;
  byte bVar16;
  uint in_ECX;
  uint extraout_EDX;
  uint uVar17;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint uVar18;
  Error EVar20;
  RACFGBuilder *this_01;
  ulong uVar21;
  int in_R8D;
  RATiedReg *pRVar22;
  uint in_R9D;
  uint uVar23;
  InvokeNode *initialNode;
  long lVar24;
  char cVar25;
  InvokeNode *pIVar26;
  bool bVar27;
  bool bVar28;
  char cVar29;
  float __x;
  int unaff_retaddr;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint32_t uStack_ce4;
  Error EStack_ce0;
  undefined4 uStack_cdc;
  uint64_t uStack_cd8;
  long lStack_cd0;
  long lStack_cc8;
  RABlock *pRStack_cc0;
  ZoneVector<asmjit::RABlock_*> ZStack_cb8;
  RAInstBuilder RStack_ca8;
  ulong uStack_70;
  ulong uVar19;
  
  this_01 = (RACFGBuilder *)&(this->_baseInst)._extraReg._id;
  if (id < this_01) {
    getRewriteIndex();
  }
  else {
    id = (uint32_t *)((long)id - (long)this_01 >> 2);
    if (id < (uint *)0x20) {
      return (uint32_t)id;
    }
  }
  getRewriteIndex();
  uVar23 = id[8] >> 8 & 0xf;
  uVar21 = (ulong)uVar23;
  uVar19 = *(ulong *)(id + 4);
  bVar16 = (byte)in_R8D;
  uVar17 = extraout_EDX;
  if (in_R8D == 0xff) {
LAB_00137ab9:
    bVar15 = (byte)unaff_retaddr;
    if (unaff_retaddr != 0xff) {
      if (3 < uVar23) goto LAB_00137bdc;
      pcVar3 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
               uVar21 * 4 + -0x60;
      *(uint *)pcVar3 = *(uint *)pcVar3 | 1 << (bVar15 & 0x1f);
      uVar17 = uVar17 | 0x2000;
    }
    *(uint *)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass =
         *(uint *)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass | uVar17;
    puVar6 = (uint *)((long)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar6 = *puVar6 | 1 << (sbyte)uVar23;
    if (uVar19 != 0) {
      if (in_R8D != 0xff) {
        if (*(char *)(uVar19 + 0x15) != -1) {
          return 0x41;
        }
        *(byte *)(uVar19 + 0x15) = bVar16;
      }
      if (unaff_retaddr != 0xff) {
        if (*(char *)(uVar19 + 0x16) != -1) {
          return 0x41;
        }
        *(byte *)(uVar19 + 0x16) = bVar15;
      }
      *(char *)(uVar19 + 0x14) = *(char *)(uVar19 + 0x14) + '\x01';
      *(uint *)(uVar19 + 4) = *(uint *)(uVar19 + 4) | uVar17;
      *(uint *)(uVar19 + 8) = *(uint *)(uVar19 + 8) & in_ECX;
      *(uint *)(uVar19 + 0xc) = *(uint *)(uVar19 + 0xc) | in_R9D;
      *(uint *)(uVar19 + 0x10) = *(uint *)(uVar19 + 0x10) | in_stack_00000008;
      bVar16 = (byte)in_stack_00000010;
      if (in_stack_00000010 < *(byte *)(uVar19 + 0x17)) {
        bVar16 = *(byte *)(uVar19 + 0x17);
      }
      *(byte *)(uVar19 + 0x17) = bVar16;
      return 0;
    }
    puVar6 = (uint *)(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap
                     .super_ZoneVectorBase._data;
    uVar18 = (int)((ulong)((long)puVar6 + (-0x38 - (long)this_01)) >> 3) * -0x55555555;
    uVar19 = (ulong)uVar18;
    if ((uVar18 & 0xffffff80) != 0) goto LAB_00137be1;
    (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap.
    super_ZoneVectorBase._data = puVar6 + 6;
    uVar19 = (ulong)*id;
    *puVar6 = *id;
    puVar6[1] = uVar17;
    puVar6[2] = in_ECX;
    puVar6[3] = in_R9D;
    puVar6[4] = in_stack_00000008;
    *(undefined1 *)(puVar6 + 5) = 1;
    *(byte *)((long)puVar6 + 0x15) = bVar16;
    *(byte *)((long)puVar6 + 0x16) = bVar15;
    *(byte *)((long)puVar6 + 0x17) = (byte)in_stack_00000010;
    *(uint **)(id + 4) = puVar6;
    if (3 < uVar23) goto LAB_00137be6;
    if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData[uVar21 - 0x78]
        != -1) {
      ppBVar1 = &(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
      *(int *)ppBVar1 = *(int *)ppBVar1 + (1 << ((byte)(uVar23 << 3) & 0x1f));
      return 0;
    }
  }
  else {
    puVar6 = (uint *)((long)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar6 = *puVar6 | 0x100 << (sbyte)uVar23;
    if (uVar23 < 4) {
      pcVar3 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
               uVar21 * 4 + -0x70;
      *(uint *)pcVar3 = *(uint *)pcVar3 | 1 << (bVar16 & 0x1f);
      uVar17 = extraout_EDX | 0x1000;
      goto LAB_00137ab9;
    }
    RAInstBuilder::add();
LAB_00137bdc:
    RAInstBuilder::add();
LAB_00137be1:
    RAInstBuilder::add();
LAB_00137be6:
    RAInstBuilder::add();
  }
  RAInstBuilder::add();
  if (extraout_EDX_00 == 0xff) {
    RAInstBuilder::addCallArg();
LAB_00137cd5:
    RAInstBuilder::addCallArg();
LAB_00137cda:
    RAInstBuilder::addCallArg();
  }
  else {
    uVar17 = id[8] >> 8 & 0xf;
    bVar16 = (byte)extraout_EDX_00;
    uVar23 = 1 << (bVar16 & 0x1f);
    *(uint *)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass =
         *(uint *)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass | 0x1101;
    if (3 < uVar17) goto LAB_00137cd5;
    pcVar3 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
             (ulong)uVar17 * 4 + -0x70;
    *(uint *)pcVar3 = *(uint *)pcVar3 | uVar23;
    puVar6 = (uint *)((long)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar6 = *puVar6 | 0x101 << (sbyte)uVar17;
    lVar24 = *(long *)(id + 4);
    if (lVar24 != 0) {
      if (*(char *)(lVar24 + 0x15) == -1) {
        *(byte *)(lVar24 + 0x15) = bVar16;
        *(uint *)(lVar24 + 8) = *(uint *)(lVar24 + 8) & uVar23;
        uVar17 = 0x1101;
      }
      else {
        *(uint *)(lVar24 + 8) = *(uint *)(lVar24 + 8) | uVar23;
        uVar17 = 0x11101;
      }
      *(char *)(lVar24 + 0x14) = *(char *)(lVar24 + 0x14) + '\x01';
      *(uint *)(lVar24 + 4) = *(uint *)(lVar24 + 4) | uVar17;
      return 0;
    }
    puVar6 = (uint *)(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap
                     .super_ZoneVectorBase._data;
    if (((int)((ulong)((long)puVar6 + (-0x38 - (long)this_01)) >> 3) * -0x55555555 & 0xffffff80U) !=
        0) goto LAB_00137cda;
    (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap.
    super_ZoneVectorBase._data = puVar6 + 6;
    *puVar6 = *id;
    puVar6[1] = 0x1101;
    puVar6[2] = uVar23;
    puVar6[3] = 0;
    puVar6[4] = 0;
    *(undefined1 *)(puVar6 + 5) = 1;
    *(byte *)((long)puVar6 + 0x15) = bVar16;
    *(undefined2 *)((long)puVar6 + 0x16) = 0xff;
    *(uint **)(id + 4) = puVar6;
    if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData
        [(ulong)uVar17 - 0x78] != -1) {
      ppBVar1 = &(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
      *(int *)ppBVar1 = *(int *)ppBVar1 + (1 << ((byte)(uVar17 << 3) & 0x1f));
      return 0;
    }
  }
  RAInstBuilder::addCallArg();
  if (extraout_EDX_01 == 0xff) {
    RAInstBuilder::addCallRet();
LAB_00137dbe:
    RAInstBuilder::addCallRet();
  }
  else {
    uVar17 = id[8] >> 8 & 0xf;
    bVar16 = (byte)extraout_EDX_01;
    uVar23 = 1 << (bVar16 & 0x1f);
    *(uint *)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass =
         *(uint *)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass | 0x2202;
    if (3 < uVar17) goto LAB_00137dbe;
    pcVar3 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
             (ulong)uVar17 * 4 + -0x70;
    *(uint *)pcVar3 = *(uint *)pcVar3 | uVar23;
    puVar6 = (uint *)((long)&(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar6 = *puVar6 | 0x101 << (sbyte)uVar17;
    lVar24 = *(long *)(id + 4);
    if (lVar24 != 0) {
      if (*(char *)(lVar24 + 0x16) == -1) {
        *(char *)(lVar24 + 0x14) = *(char *)(lVar24 + 0x14) + '\x01';
        *(uint *)(lVar24 + 4) = *(uint *)(lVar24 + 4) | 0x2202;
        *(byte *)(lVar24 + 0x16) = bVar16;
        return 0;
      }
      return 0x41;
    }
    puVar6 = (uint *)(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap
                     .super_ZoneVectorBase._data;
    if (((int)((ulong)((long)puVar6 + (-0x38 - (long)this_01)) >> 3) * -0x55555555 & 0xffffff80U) ==
        0) {
      (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap.
      super_ZoneVectorBase._data = puVar6 + 6;
      *puVar6 = *id;
      puVar6[1] = 0x2202;
      puVar6[2] = uVar23;
      puVar6[3] = 0;
      puVar6[4] = 0;
      *(undefined2 *)(puVar6 + 5) = 0xff01;
      *(byte *)((long)puVar6 + 0x16) = bVar16;
      *(undefined1 *)((long)puVar6 + 0x17) = 0;
      *(uint **)(id + 4) = puVar6;
      if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData
          [(ulong)uVar17 - 0x78] != -1) {
        ppBVar1 = &(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
        *(int *)ppBVar1 = *(int *)ppBVar1 + (1 << ((byte)(uVar17 << 3) & 0x1f));
        return 0;
      }
      goto LAB_00137dc8;
    }
  }
  RAInstBuilder::addCallRet();
LAB_00137dc8:
  RAInstBuilder::addCallRet();
  this_00 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger;
  uStack_70 = uVar19;
  if (this_00 != (Logger *)0x0) {
    Logger::logf(this_00,__x);
  }
  EVar11 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::prepare
                     (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>);
  if (EVar11 == 0) {
    if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0) {
      RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                 (BaseNode *)(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode,2,
                 (char *)0x0);
    }
    if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0) {
      RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                 (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock,2);
    }
    pFVar7 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode;
    pIVar26 = (InvokeNode *)
              ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pFVar7->super_LabelNode)->_links[1];
    if (pIVar26 == (InvokeNode *)0x0) {
LAB_001387f7:
      EVar11 = 3;
    }
    else {
      item = &(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
      pRStack_cc0 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
      pRStack_cc0->_first = (BaseNode *)pFVar7;
      pRStack_cc0->_last = (BaseNode *)pFVar7;
      RStack_ca8._cur = RStack_ca8._tiedRegs;
      RStack_ca8._clobbered._masks[0] = 0;
      RStack_ca8._clobbered._masks[1] = 0;
      RStack_ca8._clobbered._masks[2] = 0;
      RStack_ca8._clobbered._masks[3] = 0;
      RStack_ca8._used._masks[0] = 0;
      RStack_ca8._used._masks[1] = 0;
      RStack_ca8._used._masks[2] = 0;
      RStack_ca8._used._masks[3] = 0;
      RStack_ca8._aggregatedFlags = 0;
      RStack_ca8._forbiddenFlags = 0;
      RStack_ca8._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
      RStack_ca8._stats._packed = 0;
      ZStack_cb8.super_ZoneVectorBase._data = (void *)0x0;
      ZStack_cb8.super_ZoneVectorBase._size = 0;
      ZStack_cb8.super_ZoneVectorBase._capacity = 0;
      EVar12 = EVar11;
      do {
        uVar5 = (pIVar26->super_InstNode).super_BaseNode._position;
        if (1 < uVar5 + 1) {
LAB_001387d5:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O1/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x6f,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(pIVar26->super_InstNode).super_BaseNode.field_0._links[1];
        EVar13 = EVar11;
        if (((pIVar26->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) != 0) {
          if (*item == (RABlock *)0x0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::removeNode
                      (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,(BaseNode *)pIVar26)
            ;
            cVar29 = '\x05';
            pIVar26 = initialNode;
            goto LAB_0013827c;
          }
          (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = true;
          uVar4 = (pIVar26->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if ((byte)(uVar4 - 0x11) < 2) {
            if (uVar5 == 0xffffffff) {
              (pIVar26->super_InstNode).super_BaseNode._position = 0;
            }
            else {
              pBVar9 = (pIVar26->super_InstNode).super_BaseNode.field_0.field_0._prev;
              if (uVar4 == '\x12') {
                EVar12 = x86::RACFGBuilder::onBeforeInvoke(this_01,pIVar26);
              }
              else {
                EVar12 = x86::RACFGBuilder::onBeforeRet(this_01,(FuncRetNode *)pIVar26);
              }
              if (EVar12 == 0) {
                if (pBVar9 != (pIVar26->super_InstNode).super_BaseNode.field_0.field_0._prev) {
                  if ((InvokeNode *)(*item)->_first == pIVar26) {
                    (*item)->_first = (pBVar9->field_0).field_0._next;
                  }
                  (pIVar26->super_InstNode).super_BaseNode._position = 0xffffffff;
                  pIVar26 = (InvokeNode *)(pBVar9->field_0)._links[1];
                  if ((*(byte *)((long)&pIVar26->super_InstNode + 0x11) & 0x20) == 0)
                  goto LAB_001387f2;
                }
                initialNode = (InvokeNode *)
                              ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pIVar26->super_InstNode)
                              ->_links[1];
                bVar28 = true;
                EVar12 = EVar11;
              }
              else {
                bVar28 = false;
              }
              cVar29 = '\x01';
              EVar13 = EVar12;
              if (!bVar28) goto LAB_0013827c;
            }
          }
          if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                      (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,(BaseNode *)pIVar26,
                       4,(char *)0x0);
          }
          uStack_ce4 = 0;
          RStack_ca8._aggregatedFlags = 0;
          RStack_ca8._forbiddenFlags = 0;
          RStack_ca8._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          RStack_ca8._stats._packed = 0;
          RStack_ca8._used._masks[0] = 0;
          RStack_ca8._used._masks[1] = 0;
          RStack_ca8._used._masks[2] = 0;
          RStack_ca8._used._masks[3] = 0;
          RStack_ca8._clobbered._masks[0] = 0;
          RStack_ca8._clobbered._masks[1] = 0;
          RStack_ca8._clobbered._masks[2] = 0;
          RStack_ca8._clobbered._masks[3] = 0;
          RStack_ca8._cur = RStack_ca8._tiedRegs;
          EVar11 = x86::RACFGBuilder::onInst
                             (this_01,&pIVar26->super_InstNode,&uStack_ce4,&RStack_ca8);
          cVar25 = '\x01';
          cVar29 = cVar25;
          if ((EVar11 == 0) &&
             (((pIVar26->super_InstNode).super_BaseNode.field_1._any._nodeType != '\x12' ||
              (EVar11 = x86::RACFGBuilder::onInvoke(this_01,pIVar26,&RStack_ca8), EVar11 == 0)))) {
            if ((pIVar26->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x11') {
              EVar11 = x86::RACFGBuilder::onRet(this_01,(FuncRetNode *)pIVar26,&RStack_ca8);
              if (EVar11 != 0) goto LAB_0013819e;
              uStack_ce4 = 4;
            }
            if ((uStack_ce4 == 1) && (RStack_ca8._tiedRegs != RStack_ca8._cur)) {
              pBVar10 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
              pRVar14 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
              pRVar22 = RStack_ca8._tiedRegs;
              uVar19 = 0;
              do {
                if ((pBVar10->_workRegs).super_ZoneVectorBase._size <= pRVar22->_workId) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  goto LAB_001387d5;
                }
                uVar21 = uVar19;
                if ((*(byte *)(*(long *)((long)(pBVar10->_workRegs).super_ZoneVectorBase._data +
                                        (ulong)pRVar22->_workId * 8) + 0x21) & 0xf) == 0) {
                  bVar16 = (pRVar22->field_5).field_0._useId;
                  if (bVar16 == 0xff) {
                    uVar21 = (ulong)((int)uVar19 + 1);
                    bVar16 = pBVar10->_scratchRegIndexes[uVar19];
                    (pRVar22->field_5).field_0._useId = bVar16;
                  }
                  puVar2 = &pRVar14->_exitScratchGpRegs;
                  *puVar2 = *puVar2 | 1 << (bVar16 & 0x1f);
                }
                pRVar22 = pRVar22 + 1;
                uVar19 = uVar21;
              } while (pRVar22 != RStack_ca8._cur);
            }
            EVar11 = BaseRAPass::assignRAInst
                               ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                (BaseNode *)pIVar26,
                                (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock,
                                &RStack_ca8);
            uVar5 = uStack_ce4;
            if (EVar11 == 0) {
              uVar17 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats.
                       _packed | RStack_ca8._stats._packed;
              (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed =
                   uVar17;
              if (uStack_ce4 != 0) {
                if (uStack_ce4 < 3) {
                  pRVar14 = *item;
                  pRVar14->_last = (BaseNode *)pIVar26;
                  uVar23 = pRVar14->_flags;
                  pRVar14->_flags = uVar23 | 0x101;
                  (pRVar14->_regsStats)._packed = (pRVar14->_regsStats)._packed | uVar17;
                  if (((pIVar26->super_InstNode)._baseInst._options & 2) == 0) {
                    bVar16 = (pIVar26->super_InstNode).super_BaseNode.field_1._any._reserved0;
                    if (bVar16 == 0) {
                      cVar29 = '\x01';
                      EVar12 = 3;
                    }
                    else {
                      uVar17 = bVar16 - 1;
                      if (((pIVar26->super_InstNode)._opArray[uVar17]._signature & 7) == 4) {
                        EVar11 = BaseBuilder::labelNodeOf
                                           (&((this_01->
                                              super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc)->
                                             super_BaseBuilder,(LabelNode **)&EStack_ce0,
                                            (pIVar26->super_InstNode)._opArray[uVar17]._baseId);
                        if (EVar11 == 0) {
                          bVar28 = false;
                          pRVar14 = BaseRAPass::newBlockOrExistingAt
                                              ((this_01->
                                               super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass
                                               ,(LabelNode *)CONCAT44(uStack_cdc,EStack_ce0),
                                               (BaseNode **)0x0);
                          if (pRVar14 == (RABlock *)0x0) {
                            EVar11 = 1;
                          }
                          else {
                            *(byte *)&pRVar14->_flags = (byte)pRVar14->_flags | 4;
                            EVar13 = RABlock::appendSuccessor(*item,pRVar14);
                            bVar28 = EVar13 == 0;
                            EVar11 = EVar12;
                            if (!bVar28) {
                              EVar11 = EVar13;
                            }
                          }
                        }
                        else {
                          bVar28 = false;
                        }
                        cVar29 = '\x01';
                        EVar12 = EVar11;
                        if (bVar28) {
LAB_001385cb:
                          cVar29 = '\0';
                          EVar12 = EVar11;
                        }
                      }
                      else {
                        pRVar14->_flags = uVar23 | 0x501;
                        if ((pIVar26->super_InstNode).super_BaseNode.field_1._any._nodeType ==
                            '\x0f') {
                          lVar24._0_1_ = (pIVar26->_funcDetail)._callConv._id;
                          lVar24._1_1_ = (pIVar26->_funcDetail)._callConv._arch;
                          lVar24._2_1_ = (pIVar26->_funcDetail)._callConv._strategy;
                          lVar24._3_1_ = (pIVar26->_funcDetail)._callConv._redZoneSize;
                          lVar24._4_1_ = (pIVar26->_funcDetail)._callConv._spillZoneSize;
                          lVar24._5_1_ = (pIVar26->_funcDetail)._callConv._naturalStackAlignment;
                          lVar24._6_2_ = (pIVar26->_funcDetail)._callConv._flags;
                        }
                        else {
                          lVar24 = 0;
                        }
                        pBVar10 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
                        if (lVar24 == 0) {
                          EVar11 = ZoneVector<asmjit::RABlock_*>::append
                                             (&ZStack_cb8,&pBVar10->_allocator,item);
                          cVar29 = '\x01';
                          if (EVar11 == 0) goto LAB_001385c5;
                        }
                        else {
                          uStack_cd8 = pBVar10->_lastTimestamp + 1;
                          pBVar10->_lastTimestamp = uStack_cd8;
                          bVar28 = (ulong)*(uint *)(lVar24 + 0x18) == 0;
                          if (!bVar28) {
                            lStack_cc8 = *(long *)(lVar24 + 0x10);
                            lStack_cd0 = (ulong)*(uint *)(lVar24 + 0x18) << 2;
                            lVar24 = 0;
                            do {
                              EVar11 = BaseBuilder::labelNodeOf
                                                 (&((this_01->
                                                    super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                                   _cc)->super_BaseBuilder,(LabelNode **)&EStack_ce0
                                                  ,*(uint32_t *)(lStack_cc8 + lVar24));
                              if (EVar11 == 0) {
                                pRVar14 = BaseRAPass::newBlockOrExistingAt
                                                    ((this_01->
                                                     super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)
                                                     ._pass,(LabelNode *)
                                                            CONCAT44(uStack_cdc,EStack_ce0),
                                                     (BaseNode **)0x0);
                                if (pRVar14 == (RABlock *)0x0) {
                                  EVar11 = 1;
                                  goto LAB_001384a7;
                                }
                                bVar27 = true;
                                if (pRVar14->_timestamp != uStack_cd8) {
                                  pRVar14->_timestamp = uStack_cd8;
                                  *(byte *)&pRVar14->_flags = (byte)pRVar14->_flags | 4;
                                  EVar11 = RABlock::appendSuccessor(*item,pRVar14);
                                  bVar27 = EVar11 == 0;
                                  if (!bVar27) {
                                    EVar12 = EVar11;
                                  }
                                }
                              }
                              else {
LAB_001384a7:
                                bVar27 = false;
                                EVar12 = EVar11;
                              }
                              if (!bVar27) {
                                cVar29 = '\x01';
                                goto LAB_001385a0;
                              }
                              lVar24 = lVar24 + 4;
                              bVar28 = lStack_cd0 == lVar24;
                            } while (!bVar28);
                          }
                          cVar29 = '\x1c';
LAB_001385a0:
                          EVar11 = EVar12;
                          if (bVar28) {
                            EVar12 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::
                                     shareAssignmentAcrossSuccessors
                                               (&this_01->
                                                 super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                                                (this_01->
                                                super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                                _curBlock);
                            cVar29 = EVar12 != 0;
                            if ((bool)cVar29) {
                              EVar11 = EVar12;
                            }
                          }
                          EVar12 = EVar11;
                          if (cVar29 == '\0') {
LAB_001385c5:
                            EVar11 = EVar12;
                            cVar29 = '\0';
                          }
                        }
                        EVar12 = EVar11;
                        if (cVar29 == '\0') goto LAB_001385cb;
                      }
                    }
                    EVar11 = EVar12;
                    if (cVar29 != '\0') goto LAB_0013819e;
                  }
                  if (uVar5 != 1) {
                    pIVar26 = initialNode;
                    if (initialNode == (InvokeNode *)0x0) {
                      EVar11 = 3;
                      cVar29 = cVar25;
                      goto LAB_0013819e;
                    }
                    if ((((anon_union_4_4_9308554c_for_BaseNode_2 *)
                         ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode +
                         1))->_any)._nodeType == '\x03') {
                      pRVar14 = *(RABlock **)
                                 &((anon_union_16_2_06f92970_for_BaseNode_0 *)
                                  &initialNode->super_InstNode)[2].field_0;
                      if (pRVar14 == (RABlock *)0x0) {
                        pRVar14 = BaseRAPass::newBlock
                                            ((this_01->
                                             super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                             (BaseNode *)initialNode);
                        if (pRVar14 == (RABlock *)0x0) goto LAB_00138769;
                        *(RABlock **)
                         &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)
                          [2].field_0 = pRVar14;
                      }
                    }
                    else {
                      pRVar14 = BaseRAPass::newBlock
                                          ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)
                                           ._pass,(BaseNode *)initialNode);
                      if (pRVar14 == (RABlock *)0x0) {
LAB_00138769:
                        EVar11 = 1;
                        cVar29 = '\x01';
                        goto LAB_0013819e;
                      }
                    }
                    pRVar8 = *item;
                    puVar2 = &pRVar8->_flags;
                    *puVar2 = *puVar2 | 0x200;
                    EVar11 = RABlock::prependSuccessor(pRVar8,pRVar14);
                    cVar29 = cVar25;
                    if (EVar11 == 0) {
                      (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar14;
                      (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
                      (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats.
                      _packed = 0;
                      if ((pRVar14->_flags & 1) == 0) {
                        EVar11 = BaseRAPass::addBlock
                                           ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>
                                            )._pass,pRVar14);
                        if ((EVar11 == 0) &&
                           (EVar11 = EVar12, cVar29 = '\x05',
                           (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger !=
                           (Logger *)0x0)) {
                          RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                                    (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                                     (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                     _curBlock,2);
                        }
                      }
                      else {
                        EVar11 = EVar12;
                        cVar29 = '\x04';
                      }
                    }
                    goto LAB_0013819e;
                  }
                  *item = (RABlock *)0x0;
                }
                if (uVar5 == 4) {
                  pRVar14 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
                  pRVar14->_last = (BaseNode *)pIVar26;
                  *(byte *)&pRVar14->_flags = (byte)pRVar14->_flags | 1;
                  (pRVar14->_regsStats)._packed =
                       (pRVar14->_regsStats)._packed |
                       (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats.
                       _packed;
                  EVar11 = RABlock::appendSuccessor
                                     (pRVar14,(this_01->
                                              super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                              _retBlock);
                  cVar29 = cVar25;
                  if (EVar11 != 0) goto LAB_0013819e;
                  *item = (RABlock *)0x0;
                }
              }
              EVar11 = EVar12;
              cVar29 = '\0';
            }
          }
LAB_0013819e:
          EVar13 = EVar11;
          EVar12 = EVar11;
          if (cVar29 != '\0') goto LAB_0013827c;
          goto LAB_0013826d;
        }
        if ((pIVar26->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x03') {
          pRVar14 = *item;
          pRVar8 = (RABlock *)(pIVar26->super_InstNode).super_BaseNode._passData;
          if (pRVar14 != (RABlock *)0x0) {
            if (pRVar8 == (RABlock *)0x0) {
              if ((pRVar14 == pRStack_cc0 |
                  (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode) == 1) {
                if ((InvokeNode *)pRVar14->_last == pIVar26) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                pRVar14->_last = (pIVar26->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar14->_flags = pRVar14->_flags | 0x201;
                (pRVar14->_regsStats)._packed =
                     (pRVar14->_regsStats)._packed |
                     (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats.
                     _packed;
                pRVar14 = BaseRAPass::newBlock
                                    ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass
                                     ,(BaseNode *)pIVar26);
                cVar29 = '\x01';
                if (pRVar14 == (RABlock *)0x0) {
                  bVar28 = false;
                  EVar11 = 1;
                }
                else {
                  *(byte *)&pRVar14->_flags = (byte)pRVar14->_flags | 4;
                  EVar12 = RABlock::appendSuccessor(*item,pRVar14);
                  if ((EVar12 == 0) &&
                     (EVar12 = BaseRAPass::addBlock
                                         ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                          _pass,pRVar14), EVar12 == 0)) {
                    (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar14;
                    (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
                    (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed
                         = 0;
                    bVar28 = true;
                  }
                  else {
                    bVar28 = false;
                    EVar11 = EVar12;
                  }
                }
                EVar13 = EVar11;
                EVar12 = EVar11;
                if (!bVar28) goto LAB_0013827c;
              }
              (pIVar26->super_InstNode).super_BaseNode._passData = *item;
              EVar20 = EVar12;
            }
            else {
              *(byte *)&pRVar8->_flags = (byte)pRVar8->_flags | 4;
              if (pRVar14 == pRVar8) {
                bVar28 = true;
                if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode == true) {
                  EVar12 = 3;
LAB_00137f23:
                  EVar11 = EVar12;
                  bVar28 = false;
                  EVar12 = EVar11;
                }
              }
              else {
                if ((InvokeNode *)pRVar14->_last == pIVar26) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
LAB_001387f2:
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  goto LAB_001387f7;
                }
                pRVar14->_last = (pIVar26->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar14->_flags = pRVar14->_flags | 0x201;
                (pRVar14->_regsStats)._packed =
                     (pRVar14->_regsStats)._packed |
                     (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats.
                     _packed;
                EVar12 = RABlock::appendSuccessor(pRVar14,pRVar8);
                if ((EVar12 != 0) ||
                   (EVar12 = BaseRAPass::addBlock
                                       ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                        _pass,pRVar8), EVar12 != 0)) goto LAB_00137f23;
                (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar8;
                (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
                (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed = 0
                ;
                bVar28 = true;
                EVar12 = EVar11;
              }
              cVar29 = '\x01';
              EVar13 = EVar11;
              EVar20 = EVar12;
              if (!bVar28) goto LAB_0013827c;
            }
LAB_00138224:
            pRVar14 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
            if (((pRVar14 != (RABlock *)0x0) &&
                (pRVar14 !=
                 (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._lastLoggedBlock)) &&
               ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0))
            {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                        (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,pRVar14,2);
            }
            if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0)
            {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                        (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                         (BaseNode *)pIVar26,2,(char *)0x0);
            }
            EVar12 = EVar20;
            if ((pIVar26->super_InstNode)._baseInst._id ==
                (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._exitLabelId) {
              pRVar14 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
              pRVar14->_last = (BaseNode *)pIVar26;
              *(byte *)&pRVar14->_flags = (byte)pRVar14->_flags | 1;
              (pRVar14->_regsStats)._packed =
                   (pRVar14->_regsStats)._packed |
                   (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed;
              EVar12 = BaseRAPass::addExitBlock
                                 ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                  pRVar14);
              cVar29 = '\x01';
              EVar13 = EVar12;
              if (EVar12 != 0) goto LAB_0013827c;
              *item = (RABlock *)0x0;
              EVar12 = EVar11;
            }
            goto LAB_0013826d;
          }
          *item = pRVar8;
          if (pRVar8 == (RABlock *)0x0) {
            pRVar14 = BaseRAPass::newBlock
                                ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                 (BaseNode *)pIVar26);
            (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar14;
            if (pRVar14 != (RABlock *)0x0) {
              (pIVar26->super_InstNode).super_BaseNode._passData = pRVar14;
              goto LAB_001381ed;
            }
            cVar29 = '\x01';
            EVar13 = 1;
            EVar12 = 1;
          }
          else {
            cVar29 = '\x04';
            if ((pRVar8->_flags & 1) == 0) {
LAB_001381ed:
              pRVar14 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
              puVar2 = &pRVar14->_flags;
              *puVar2 = *puVar2 | 4;
              (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
              (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed = 0;
              EVar12 = BaseRAPass::addBlock
                                 ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                  pRVar14);
              cVar29 = '\x01';
              EVar13 = EVar12;
              EVar20 = EVar11;
              if (EVar12 == 0) goto LAB_00138224;
            }
          }
        }
        else {
          if ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                      (&this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,(BaseNode *)pIVar26,
                       4,(char *)0x0);
          }
          uVar4 = (pIVar26->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar4 == '\n') {
            if (pIVar26 ==
                (InvokeNode *)
                ((this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode)->_end) {
              cVar29 = '\x04';
              if (*item == (RABlock *)0x0) goto LAB_0013827c;
LAB_00137fc5:
              cVar29 = '\x01';
              EVar13 = 3;
              EVar12 = 3;
              goto LAB_0013827c;
            }
          }
          else if ((uVar4 == '\x10') &&
                  (pIVar26 !=
                   (InvokeNode *)(this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode
                  )) goto LAB_00137fc5;
LAB_0013826d:
          cVar29 = '\0';
          pIVar26 = initialNode;
          EVar13 = EVar11;
          if (initialNode == (InvokeNode *)0x0) {
            EVar12 = 3;
            cVar29 = '\x01';
            EVar13 = 3;
          }
        }
LAB_0013827c:
        EVar11 = EVar13;
      } while ((cVar29 == '\0') || (cVar29 == '\x05'));
      if ((cVar29 == '\x04') &&
         (pBVar10 = (this_01->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass, EVar11 = 3,
         pBVar10->_createdBlockCount == (pBVar10->_blocks).super_ZoneVectorBase._size)) {
        RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
        EVar11 = EStack_ce0;
      }
    }
  }
  return EVar11;
}

Assistant:

ASMJIT_INLINE uint32_t getRewriteIndex(const uint32_t* id) const noexcept {
    const uint32_t* array = _getRewriteArray();
    ASMJIT_ASSERT(array <= id);

    size_t index = (size_t)(id - array);
    ASMJIT_ASSERT(index < 32);

    return uint32_t(index);
  }